

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++:90:13)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13)>
          *this,ExceptionOrValue *output)

{
  PointerReader reader;
  long *plVar1;
  undefined8 uVar2;
  ResponseHook *pRVar3;
  ExceptionOr<capnp::Response<capnp::AnyPointer>_> depResult;
  Reader local_430;
  Disposer *local_3f8;
  long *local_3f0;
  ExceptionOr<capnp::Response<capnp::DynamicStruct>_> local_3e8;
  ExceptionOrValue local_200;
  char local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  Disposer *local_40;
  ResponseHook *local_38;
  
  local_200.exception.ptr.isSet = false;
  local_68 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_200);
  if (local_200.exception.ptr.isSet == true) {
    local_3e8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_200.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_200.exception.ptr.field_1.value.ownFile.content.size_;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_200.exception.ptr.field_1.value.ownFile.content.disposer;
    local_200.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_200.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_200.exception.ptr.field_1.value.file;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_200.exception.ptr.field_1._32_8_;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_200.exception.ptr.field_1.value.description.content.ptr;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_200.exception.ptr.field_1.value.description.content.size_;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_200.exception.ptr.field_1.value.description.content.disposer;
    local_200.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_200.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_200.exception.ptr.field_1.value.context.ptr.disposer;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_200.exception.ptr.field_1.value.context.ptr.ptr;
    local_200.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_200.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_200.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_200.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_200.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_200.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3e8.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_200.exception.ptr.field_1 + 0x68),0x105);
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_200.exception.ptr.field_1.value.details.builder.ptr;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_200.exception.ptr.field_1.value.details.builder.pos;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_200.exception.ptr.field_1.value.details.builder.endPtr;
    local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_200.exception.ptr.field_1.value.details.builder.disposer;
    local_200.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_200.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_200.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3e8.value.ptr.isSet = false;
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=
              ((ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)output,&local_3e8);
    uVar2 = local_3e8.value.ptr.field_1.value.hook.ptr;
    if ((local_3e8.value.ptr.isSet == true) &&
       (local_3e8.value.ptr.field_1.value.hook.ptr != (ResponseHook *)0x0)) {
      local_3e8.value.ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
      (**(local_3e8.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                (local_3e8.value.ptr.field_1.value.hook.disposer,
                 (_func_int *)
                 ((long)&((ResponseHook *)uVar2)->_vptr_ResponseHook +
                 (long)((ResponseHook *)uVar2)->_vptr_ResponseHook[-2]));
    }
    if (local_3e8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  else if (local_68 == '\x01') {
    reader.capTable = (CapTableReader *)uStack_58;
    reader.segment = (SegmentReader *)local_60;
    reader.pointer = (WirePointer *)local_50;
    reader._24_8_ = uStack_48;
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              (&local_430,reader,(StructSchema)(this->func).resultSchemaCopy.super_Schema.raw);
    local_3f8 = local_40;
    local_3e8.value.ptr.field_1.value.hook.ptr = local_38;
    local_38 = (ResponseHook *)0x0;
    local_3e8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3e8.value.ptr.isSet = true;
    local_3e8.value.ptr.field_1.value.super_Reader.schema.super_Schema.raw =
         (StructSchema)(StructSchema)local_430.schema.super_Schema.raw;
    local_3e8.value.ptr.field_1.value.super_Reader.reader.segment = local_430.reader.segment;
    local_3e8.value.ptr.field_1.value.super_Reader.reader.capTable = local_430.reader.capTable;
    local_3e8.value.ptr.field_1.value.super_Reader.reader.data = local_430.reader.data;
    local_3e8.value.ptr.field_1.value.super_Reader.reader.pointers = local_430.reader.pointers;
    local_3e8.value.ptr.field_1.value.super_Reader.reader.dataSize = local_430.reader.dataSize;
    local_3e8.value.ptr.field_1.value.super_Reader.reader.pointerCount =
         local_430.reader.pointerCount;
    local_3e8.value.ptr.field_1._46_2_ = local_430.reader._38_2_;
    local_3e8.value.ptr.field_1._48_8_ = local_430.reader._40_8_;
    local_3f0 = (long *)0x0;
    local_3e8.value.ptr.field_1.value.hook.disposer = local_3f8;
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=
              ((ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)output,&local_3e8);
    uVar2 = local_3e8.value.ptr.field_1.value.hook.ptr;
    if ((local_3e8.value.ptr.isSet == true) &&
       (local_3e8.value.ptr.field_1.value.hook.ptr != (ResponseHook *)0x0)) {
      local_3e8.value.ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
      (**(local_3e8.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                (local_3e8.value.ptr.field_1.value.hook.disposer,
                 (_func_int *)
                 ((long)&((ResponseHook *)uVar2)->_vptr_ResponseHook +
                 (long)((ResponseHook *)uVar2)->_vptr_ResponseHook[-2]));
    }
    if (local_3e8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_3e8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    plVar1 = local_3f0;
    if (local_3f0 != (long *)0x0) {
      local_3f0 = (long *)0x0;
      (**local_3f8->_vptr_Disposer)(local_3f8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  pRVar3 = local_38;
  if ((local_68 == '\x01') && (local_38 != (ResponseHook *)0x0)) {
    local_38 = (ResponseHook *)0x0;
    (**local_40->_vptr_Disposer)
              (local_40,(_func_int *)
                        ((long)&pRVar3->_vptr_ResponseHook + (long)pRVar3->_vptr_ResponseHook[-2]));
  }
  if (local_200.exception.ptr.isSet == true) {
    Exception::~Exception(&local_200.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }